

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O2

string * __thiscall
cs222::Pass2::parseProgramLength_abi_cxx11_
          (string *__return_storage_ptr__,Pass2 *this,ifstream *ifs)

{
  string buffer;
  string line;
  stringstream lineStream;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)ifs,(string *)&line);
  std::__cxx11::stringstream::stringstream((stringstream *)&lineStream,(string *)&line,_S_out|_S_in)
  ;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&lineStream,(string *)&buffer);
  std::operator>>((istream *)&lineStream,(string *)&buffer);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator>>((istream *)&lineStream,(string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::stringstream::~stringstream((stringstream *)&lineStream);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::parseProgramLength(std::ifstream &ifs) {
        std::string line;
        getline(ifs, line);
        std::stringstream lineStream(line);
        std::string buffer;

        lineStream >> buffer; // Skip "PROGRAM"
        lineStream >> buffer; // Skip "LENGTH:"

        std::string progLength;
        lineStream >> progLength;
        return progLength;
    }